

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_units(lys_module *module,void *node,char *value,yytokentype type)

{
  LY_ERR *pLVar1;
  int local_28;
  int ret;
  yytokentype type_local;
  char *value_local;
  void *node_local;
  lys_module *module_local;
  
  switch(type) {
  case LEAF_KEYWORD:
    local_28 = yang_check_string(module,(char **)((long)node + 0xb8),"units","leaf",value,
                                 (lys_node *)node);
    break;
  case LEAF_LIST_KEYWORD:
    local_28 = yang_check_string(module,(char **)((long)node + 0xb8),"units","leaflist",value,
                                 (lys_node *)node);
    break;
  default:
    free(value);
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/parser_yang.c"
           ,0x1ce);
    local_28 = 1;
    break;
  case TYPEDEF_KEYWORD:
    local_28 = yang_check_string(module,(char **)((long)node + 0x28),"units","typedef",value,
                                 (lys_node *)0x0);
    break;
  case ADD_KEYWORD:
  case DELETE_KEYWORD:
  case REPLACE_KEYWORD:
    local_28 = yang_check_string(module,(char **)((long)node + 0x30),"units","deviate",value,
                                 (lys_node *)0x0);
  }
  return local_28;
}

Assistant:

int
yang_read_units(struct lys_module *module, void *node, char *value, enum yytokentype type)
{
    int ret;

    switch (type) {
    case LEAF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaf *) node)->units, "units", "leaf", value, node);
        break;
    case LEAF_LIST_KEYWORD:
        ret = yang_check_string(module, &((struct lys_node_leaflist *) node)->units, "units", "leaflist", value, node);
        break;
    case TYPEDEF_KEYWORD:
        ret = yang_check_string(module, &((struct lys_tpdf *) node)->units, "units", "typedef", value, NULL);
        break;
    case ADD_KEYWORD:
    case REPLACE_KEYWORD:
    case DELETE_KEYWORD:
        ret = yang_check_string(module, &((struct lys_deviate *) node)->units, "units", "deviate", value, NULL);
        break;
    default:
        free(value);
        LOGINT;
        ret = EXIT_FAILURE;
        break;
    }
    return ret;
}